

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O1

int wrterr(FILE *out,char *mess,int severity)

{
  int iVar1;
  int extraout_EAX;
  size_t sVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined4 *extraout_RDX;
  undefined4 *extraout_RDX_00;
  char *__s;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  FILE *out_00;
  FILE *__stream;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  char acStack_7a8 [1608];
  FILE *pFStack_160;
  undefined1 *puStack_158;
  code *pcStack_148;
  char acStack_140 [264];
  FILE *pFStack_38;
  
  if (severity < err_report) {
    ffcmsg();
    iVar1 = 0;
  }
  else {
    nerrs = nerrs + 1;
    builtin_strncpy(temp,"*** Error:   ",0xe);
    strcat(temp,mess);
    if (out != (FILE *)0x0) {
      if ((_stdout != (FILE *)out) && (_stderr != (FILE *)out)) {
        print_fmt(out,temp,0xd);
      }
      mess = temp;
      print_fmt((FILE *)_stderr,temp,0xd);
    }
    if (200 < nerrs) {
      out_00 = (FILE *)out;
      wrterr_cold_1();
      pcVar6 = acStack_140;
      pFStack_38 = out;
      if ((int)in_RCX < err_report) {
        pcStack_148 = (code *)0x1116b0;
        ffcmsg();
        iVar1 = 0;
      }
      else {
        nerrs = nerrs + 1;
        builtin_strncpy(temp,"*** Error:   ",0xe);
        pcVar9 = temp;
        pcStack_148 = (code *)0x1116f4;
        strcat(temp,mess);
        pcStack_148 = (code *)0x111702;
        ffgerr(*extraout_RDX,acStack_140);
        pcStack_148 = (code *)0x11170d;
        strcat(temp,acStack_140);
        if (out_00 != (FILE *)0x0) {
          pcVar9 = &stderr;
          if ((_stdout != out_00) && (_stderr != out_00)) {
            pcStack_148 = (code *)0x11173e;
            print_fmt((FILE *)out_00,temp,0xd);
          }
          pcVar6 = temp;
          pcStack_148 = (code *)0x111752;
          print_fmt((FILE *)_stderr,temp,0xd);
        }
        *extraout_RDX = 0;
        pcStack_148 = (code *)0x11175e;
        ffcmsg();
        iVar1 = nerrs;
        if (200 < nerrs) {
          pcStack_148 = wrtserr;
          __stream = out_00;
          wrtferr_cold_1();
          pcVar8 = acStack_7a8;
          pFStack_160 = out_00;
          pcStack_148 = (code *)pcVar9;
          if ((int)in_RCX < err_report) {
            puStack_158 = acStack_140;
            ffcmsg();
            iVar1 = 0;
          }
          else {
            nerrs = nerrs + 1;
            builtin_strncpy(temp,"*** Error:   ",0xe);
            puStack_158 = acStack_140;
            strcat(temp,pcVar6);
            sVar2 = strlen(temp);
            builtin_strncpy(temp + sVar2,"(from CF",8);
            builtin_strncpy(temp + sVar2 + 8,"ITSIO er",8);
            builtin_strncpy(temp + sVar2 + 0xc,"O er",4);
            builtin_strncpy(temp + sVar2 + 0x10,"ror ",4);
            builtin_strncpy(temp + sVar2 + 0x14,"stac",4);
            builtin_strncpy(temp + sVar2 + 0x18,"k:)",4);
            lVar10 = 0;
            do {
              *pcVar8 = '\0';
              iVar1 = ffgmsg(pcVar8);
              uVar5 = (uint)pcVar6;
              uVar3 = (uint)in_RCX;
              if ((iVar1 == 0) && (*pcVar8 == '\0')) goto LAB_00111836;
              lVar10 = lVar10 + 1;
              pcVar8 = pcVar8 + 0x50;
            } while (lVar10 != 0x14);
            lVar10 = 0x14;
LAB_00111836:
            if (__stream != (FILE *)0x0) {
              uVar5 = (uint)lVar10;
              wrtserr_cold_1();
            }
            *extraout_RDX_00 = 0;
            ffcmsg();
            iVar1 = nerrs;
            if (200 < nerrs) {
              wrtserr_cold_2();
              sVar2 = strlen(__s);
              uVar7 = (uint)sVar2;
              if ((int)uVar3 < (int)uVar7) {
                uVar3 = uVar7;
              }
              if ((int)uVar3 < 1) {
                return uVar7;
              }
              pcVar6 = (char *)malloc((ulong)(uVar3 + 1));
              if ((int)uVar7 < 1) {
                memset(pcVar6,uVar5 & 0xff,(ulong)uVar3);
                pcVar9 = pcVar6 + uVar3;
              }
              else {
                uVar4 = (int)(uVar3 - uVar7) / 2;
                pcVar8 = pcVar6;
                if (1 < (int)(uVar3 - uVar7)) {
                  memset(pcVar6,uVar5 & 0xff,(ulong)(uVar4 - 1) + 1);
                  pcVar8 = pcVar6 + (ulong)(uVar4 - 1) + 1;
                }
                *pcVar8 = '\0';
                strcat(pcVar6,__s);
                pcVar9 = pcVar8 + (uVar7 & 0x7fffffff);
                if ((int)(uVar4 + uVar7) < (int)uVar3) {
                  uVar11 = (ulong)((uVar3 + ~uVar4) - uVar7);
                  memset(pcVar9,uVar5 & 0xff,uVar11 + 1);
                  pcVar9 = pcVar8 + (uVar7 & 0x7fffffff) + uVar11 + 1;
                }
              }
              *pcVar9 = '\0';
              if (__stream != (FILE *)0x0) {
                fprintf(__stream,"%s\n",pcVar6);
              }
              if (_stdout == __stream) {
                fflush(__stream);
              }
              free(pcVar6);
              return extraout_EAX;
            }
          }
          return iVar1;
        }
      }
      return iVar1;
    }
    ffcmsg();
    iVar1 = nerrs;
  }
  return iVar1;
}

Assistant:

int wrterr(FILE *out, char *mess, int severity )
{

    if(severity < err_report) { 
        fits_clear_errmsg();
        return 0; 
    }
    nerrs++;

    strcpy(temp,"*** Error:   ");
    strcat(temp,mess);
    if(out != NULL) {
         if ((out!=stdout) && (out!=stderr)) print_fmt(out,temp,13);
/*
   if ERR2OUT is defined, then error messages will be sent to the
   stdout stream rather than to stderr
*/
#ifdef ERR2OUT
         print_fmt(stdout,temp,13);
#else
         print_fmt(stderr,temp,13);
#endif
    }

    if(nerrs > MAXERRORS ) { 

#ifdef ERR2OUT
	 fprintf(stdout,"??? Too many Errors! I give up...\n");
#else
	 fprintf(stderr,"??? Too many Errors! I give up...\n");
#endif
         close_report(out);
         exit(1);
    }
    fits_clear_errmsg();
    return nerrs;
}